

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O3

void duckdb_zstd::ZSTD_buildFSETable_body_bmi2
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize)

{
  ushort uVar1;
  sbyte sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  U16 *symbolNext;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  U32 tableMask;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  size_t s;
  ulong uVar14;
  ulong uVar15;
  undefined4 uVar16;
  short sVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  sVar2 = ((byte)tableLog < 0x21) * (' ' - (byte)tableLog);
  uVar8 = (uint)(-1 << sVar2) >> sVar2;
  uVar16 = 1;
  uVar13 = 1 << (tableLog & 0x1f);
  uVar7 = maxSymbolValue + 1;
  if (uVar7 == 0) {
    dt->nextState = 1;
    dt->nbAdditionalBits = '\0';
    dt->nbBits = '\0';
    dt->baseValue = tableLog;
    iVar5 = (uVar13 >> 3) + (uVar13 >> 1) + 3;
  }
  else {
    uVar6 = (ulong)uVar7;
    uVar15 = 0;
    uVar9 = uVar8;
    do {
      sVar17 = normalizedCounter[uVar15];
      if (sVar17 == -1) {
        uVar12 = (ulong)uVar9;
        uVar9 = uVar9 - 1;
        dt[uVar12 + 1].baseValue = (U32)uVar15;
        sVar17 = 1;
      }
      else if ((0x10000 << (tableLog - 1 & 0x1f)) >> 0x10 <= (int)sVar17) {
        uVar16 = 0;
      }
      *(short *)((long)wksp + uVar15 * 2) = sVar17;
      uVar15 = uVar15 + 1;
    } while (uVar6 != uVar15);
    dt->nextState = (short)uVar16;
    dt->nbAdditionalBits = (char)((uint)uVar16 >> 0x10);
    dt->nbBits = (char)((uint)uVar16 >> 0x18);
    dt->baseValue = tableLog;
    auVar4 = _DAT_003b4370;
    auVar3 = _DAT_003b4360;
    if (uVar9 != uVar8) {
      if (uVar7 != 0) {
        uVar15 = 0;
        uVar7 = 0;
        do {
          sVar17 = normalizedCounter[uVar15];
          if (0 < sVar17) {
            iVar5 = 0;
            do {
              dt[(ulong)uVar7 + 1].baseValue = (U32)uVar15;
              do {
                uVar7 = uVar7 + (uVar13 >> 1) + (uVar13 >> 3) + 3 & uVar8;
              } while (uVar9 < uVar7);
              iVar5 = iVar5 + 1;
            } while (iVar5 != sVar17);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar6);
      }
      goto LAB_0038b02a;
    }
    iVar5 = (uVar13 >> 3) + (uVar13 >> 1) + 3;
    if (uVar7 != 0) {
      uVar15 = 0;
      lVar18 = 0;
      lVar10 = 0;
      do {
        uVar1 = normalizedCounter[uVar15];
        *(long *)((long)wksp + lVar18 + 0x6a) = lVar10;
        if (8 < (long)(short)uVar1) {
          uVar11 = 0x10;
          if (0x10 < uVar1) {
            uVar11 = uVar1;
          }
          uVar14 = (ulong)uVar11 - 9;
          auVar21._8_4_ = (int)uVar14;
          auVar21._0_8_ = uVar14;
          auVar21._12_4_ = (int)(uVar14 >> 0x20);
          auVar19._0_8_ = uVar14 >> 3;
          auVar19._8_8_ = auVar21._8_8_ >> 3;
          auVar19 = auVar19 ^ auVar4;
          uVar12 = 0;
          do {
            auVar20._8_4_ = (int)uVar12;
            auVar20._0_8_ = uVar12;
            auVar20._12_4_ = (int)(uVar12 >> 0x20);
            auVar21 = (auVar20 | auVar3) ^ auVar4;
            if ((bool)(~(auVar19._4_4_ < auVar21._4_4_ ||
                        auVar19._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar19._4_4_) & 1)) {
              *(long *)((long)wksp + uVar12 * 8 + lVar18 + 0x72) = lVar10;
            }
            if (auVar21._12_4_ <= auVar19._12_4_ &&
                (auVar21._8_4_ <= auVar19._8_4_ || auVar21._12_4_ != auVar19._12_4_)) {
              *(long *)((long)wksp + uVar12 * 8 + lVar18 + 0x7a) = lVar10;
            }
            uVar12 = uVar12 + 2;
          } while (((uVar14 >> 3) + 2 & 0xfffffffffffffffe) != uVar12);
        }
        lVar18 = lVar18 + (short)uVar1;
        uVar15 = uVar15 + 1;
        lVar10 = lVar10 + 0x101010101010101;
      } while (uVar15 != uVar6);
    }
  }
  uVar15 = 0;
  uVar7 = 0 >> sVar2;
  do {
    dt[(ulong)(uVar7 & uVar8) + 1].baseValue = (uint)*(byte *)((long)wksp + uVar15 + 0x6a);
    dt[(ulong)(uVar7 + iVar5 & uVar8) + 1].baseValue = (uint)*(byte *)((long)wksp + uVar15 + 0x6b);
    uVar7 = uVar7 + iVar5 * 2 & uVar8;
    uVar15 = uVar15 + 2;
  } while (uVar15 < uVar13);
LAB_0038b02a:
  uVar15 = 0;
  do {
    uVar6 = (ulong)dt[uVar15 + 1].baseValue;
    uVar1 = *(ushort *)((long)wksp + uVar6 * 2);
    *(ushort *)((long)wksp + uVar6 * 2) = uVar1 + 1;
    iVar5 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    dt[uVar15 + 1].nbBits = (BYTE)(tableLog - iVar5);
    dt[uVar15 + 1].nextState = (uVar1 << (tableLog - iVar5 & 0x1f)) - (short)uVar13;
    dt[uVar15 + 1].nbAdditionalBits = nbAdditionalBits[uVar6];
    dt[uVar15 + 1].baseValue = baseValue[uVar6];
    uVar15 = uVar15 + 1;
  } while (uVar13 != uVar15);
  return;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static void ZSTD_buildFSETable_body_bmi2(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize)
{
    ZSTD_buildFSETable_body(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}